

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpztriangle.cpp
# Opt level: O0

void pztopology::TPZTriangle::ComputeHCurlFaceDirections<Fad<double>>
               (TPZVec<Fad<double>_> *v1,TPZVec<Fad<double>_> *v2,int transformationId)

{
  undefined4 in_EDX;
  TPZVec<Fad<double>_> *in_RSI;
  TPZVec<Fad<double>_> *in_RDI;
  int i;
  int iVar1;
  
  for (iVar1 = 0; iVar1 < 2; iVar1 = iVar1 + 1) {
    TPZVec<Fad<double>_>::operator[](in_RDI,(long)iVar1);
    Fad<double>::operator=<double,_nullptr>((Fad<double> *)in_RSI,(double *)CONCAT44(in_EDX,iVar1));
    TPZVec<Fad<double>_>::operator[](in_RSI,(long)iVar1);
    Fad<double>::operator=<double,_nullptr>((Fad<double> *)in_RSI,(double *)CONCAT44(in_EDX,iVar1));
  }
  return;
}

Assistant:

void TPZTriangle::ComputeHCurlFaceDirections(TPZVec<TVar> &v1, TPZVec<TVar> &v2, int transformationId)
    {
        for (auto i=0; i< Dimension; i++){
            //v^{F,T} orthonormal vectors associated with face F and tangent to it.
            v1[i] = fTangentVectors[2*transformationId][i];
            v2[i] = fTangentVectors[2*transformationId + 1][i];
        }//for
    }